

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O2

void __thiscall
punky::ast::FunctionLiteral::FunctionLiteral
          (FunctionLiteral *this,Token *tok,OptFnParams *params,
          unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *body)

{
  Token local_50;
  
  punky::tok::Token::Token(&local_50,tok);
  ExprNode::ExprNode(&this->super_ExprNode,&local_50);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50.m_literal);
  (this->super_ExprNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR__FunctionLiteral_0011da70;
  (this->m_params).
  super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
  ._M_engaged = false;
  if ((params->
      super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
      ._M_engaged == true) {
    (this->m_params).
    super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
    ._M_payload = (params->
                  super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
                  ._M_payload;
    (params->
    super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
    ._M_payload = (_Storage<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false>
                   )0x0;
    (this->m_params).
    super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
    ._M_engaged = true;
  }
  (this->m_body)._M_t.
  super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t.
  super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
  super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl =
       (body->_M_t).
       super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>.
       _M_t.
       super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
       super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl;
  (body->_M_t).
  super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t.
  super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
  super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl = (BlockStmt *)0x0;
  return;
}

Assistant:

FunctionLiteral(Token tok, OptFnParams params,
                    std::unique_ptr<BlockStmt> body) :
      ExprNode{std::move(tok)},
      m_params{std::move(params)},
      m_body{std::move(body)}
    {}